

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netban.cpp
# Opt level: O0

int __thiscall CNetBan::UnbanByRange(CNetBan *this,CNetRange *pRange)

{
  bool bVar1;
  IConsole *pIVar2;
  CDataType *in_RSI;
  CNetBan *in_RDI;
  CNetBan *pBanPool;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar3;
  
  pBanPool = in_RDI;
  bVar1 = CNetRange::IsValid((CNetRange *)in_RDI);
  if (bVar1) {
    iVar3 = Unban<CNetBan::CBanPool<CNetRange,16>>
                      ((CNetBan *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       (CBanPool<CNetRange,_16> *)pBanPool,in_RSI);
  }
  else {
    pIVar2 = Console(in_RDI);
    (*(pIVar2->super_IInterface)._vptr_IInterface[0x19])
              (pIVar2,0,"net_ban","ban failed (invalid range)");
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

int CNetBan::UnbanByRange(const CNetRange *pRange)
{
	if(pRange->IsValid())
		return Unban(&m_BanRangePool, pRange);

	Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "net_ban", "ban failed (invalid range)");
	return -1;
}